

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O2

void __thiscall github111116::ConsoleLogger::log<char[18]>(ConsoleLogger *this,char (*args) [18])

{
  if (0 < this->loglevel) {
    return;
  }
  std::mutex::lock(&this->mtx);
  std::operator<<(this->out,"    ");
  print<char[18]>(this,args);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}